

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-SFML.cpp
# Opt level: O0

bool ImGui::SFML::Init(RenderWindow *window,bool loadDefaultFont)

{
  bool bVar1;
  bool loadDefaultFont_local;
  RenderWindow *window_local;
  
  bVar1 = Init(&window->super_Window,&window->super_RenderTarget,loadDefaultFont);
  return bVar1;
}

Assistant:

bool Init(sf::RenderWindow& window, bool loadDefaultFont) {
    return Init(window, window, loadDefaultFont);
}